

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O1

string * __thiscall
KokkosTools::demangleNameKokkos_abi_cxx11_
          (string *__return_storage_ptr__,KokkosTools *this,string_view mangled_name)

{
  void *pvVar1;
  size_t sVar2;
  char *__s;
  long *plVar3;
  undefined8 uVar4;
  char *pcVar5;
  void *__s_00;
  KokkosTools *pKVar6;
  string *ret;
  KokkosTools *pKVar7;
  size_type __n;
  int status_1;
  int status;
  undefined8 local_a0;
  long local_90 [2];
  undefined8 local_80;
  long local_70 [2];
  string *local_60;
  long *local_58;
  long local_50;
  long local_48 [2];
  undefined4 local_34;
  
  pcVar5 = mangled_name._M_str;
  __s_00 = (void *)mangled_name._M_len;
  if (this == (KokkosTools *)0x0) {
    pKVar6 = (KokkosTools *)0xffffffffffffffff;
  }
  else {
    pvVar1 = memchr(__s_00,0x2f,(size_t)this);
    pcVar5 = (char *)((long)pvVar1 - (long)__s_00);
    pKVar6 = (KokkosTools *)(-(ulong)(pvVar1 == (void *)0x0) | (ulong)pcVar5);
  }
  if (pKVar6 + -1 < (KokkosTools *)0xfffffffffffffffe) {
    pKVar7 = pKVar6;
    if (this < pKVar6) {
      pKVar7 = this;
    }
    local_58 = local_48;
    local_60 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,__s_00,pKVar7 + (long)__s_00,pcVar5);
    plVar3 = local_58;
    local_80 = (long *)((ulong)local_80._4_4_ << 0x20);
    pcVar5 = (char *)__cxa_demangle(local_58,0,0);
    local_a0 = local_90;
    if (pcVar5 == (char *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,plVar3,local_50 + (long)plVar3);
    }
    else {
      sVar2 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,pcVar5,pcVar5 + sVar2);
      free(pcVar5);
    }
    pcVar5 = (char *)std::__cxx11::string::append((char *)&local_a0);
    pKVar7 = pKVar6 + 1;
    if (this <= pKVar6) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",pKVar7,this);
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      _Unwind_Resume(uVar4);
    }
    pKVar6 = this + -(long)pKVar7;
    if (this <= this + -(long)pKVar7) {
      pKVar6 = this;
    }
    pKVar7 = (KokkosTools *)((long)__s_00 + (long)pKVar7);
    local_34 = 0;
    __s = (char *)__cxa_demangle(pKVar7,0,0);
    local_80 = local_70;
    if (__s == (char *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,pKVar7,pKVar6 + (long)pKVar7);
    }
    else {
      sVar2 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar2);
      free(__s);
    }
    plVar3 = (long *)std::__cxx11::string::_M_append(pcVar5,(ulong)local_80);
    __return_storage_ptr__ = local_60;
    (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
    std::__cxx11::string::_M_construct<char*>((string *)local_60,*plVar3,plVar3[1] + *plVar3);
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  else {
    local_a0 = (long *)((ulong)local_a0._4_4_ << 0x20);
    pcVar5 = (char *)__cxa_demangle(__s_00,0,0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (pcVar5 == (char *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,__s_00,this + (long)__s_00);
    }
    else {
      sVar2 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar5,pcVar5 + sVar2);
      free(pcVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string demangleNameKokkos(const std::string_view mangled_name) {
  if (size_t pos = mangled_name.find('/', 0);
      pos != std::string_view::npos && pos > 0) {
    /// An explicit copy of the first part of the string is needed, because
    /// @c abi::__cxa_demangle will parse the pointer until its NULL-terminated.
    return demangleName(std::string(mangled_name.substr(0, pos)))
        .append("/")
        .append(
            demangleName(mangled_name.substr(pos + 1, mangled_name.size())));
  } else {
    return demangleName(mangled_name);
  }
}